

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_4chan(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  exr_coding_channel_info_t *peVar11;
  uint8_t *puVar12;
  int iVar13;
  long lVar14;
  uint8_t *puVar15;
  void *pvVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  uint8_t *puVar22;
  void *pvVar23;
  uint8_t *local_68;
  uint8_t *local_60;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar11 = decode->channels;
    uVar2 = peVar11->width;
    lVar18 = (long)(int)uVar2;
    iVar3 = peVar11[3].user_pixel_stride;
    iVar4 = peVar11[2].user_pixel_stride;
    iVar5 = peVar11[1].user_pixel_stride;
    iVar6 = peVar11->user_pixel_stride;
    local_60 = peVar11[3].field_12.decode_to_ptr;
    local_68 = peVar11[2].field_12.decode_to_ptr;
    puVar12 = (peVar11->field_12).decode_to_ptr;
    puVar22 = peVar11[1].field_12.decode_to_ptr;
    iVar7 = peVar11[3].user_line_stride;
    iVar8 = peVar11[2].user_line_stride;
    iVar9 = peVar11[1].user_line_stride;
    iVar10 = peVar11->user_line_stride;
    pvVar17 = decode->unpacked_buffer;
    lVar14 = (long)(int)(uVar2 * 8);
    pvVar23 = (void *)((long)pvVar17 + lVar18 * 6);
    uVar20 = (ulong)uVar2;
    pvVar21 = (void *)((long)pvVar17 + lVar18 * 2);
    pvVar16 = (void *)((long)pvVar17 + lVar18 * 4);
    iVar13 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar19 = 0;
        puVar15 = puVar12;
        do {
          *(undefined2 *)puVar15 = *(undefined2 *)((long)pvVar17 + uVar19 * 2);
          uVar19 = uVar19 + 1;
          puVar15 = puVar15 + iVar6;
        } while (uVar20 != uVar19);
      }
      if (0 < (int)uVar2) {
        uVar19 = 0;
        puVar15 = puVar22;
        do {
          *(undefined2 *)puVar15 = *(undefined2 *)((long)pvVar21 + uVar19 * 2);
          uVar19 = uVar19 + 1;
          puVar15 = puVar15 + iVar5;
        } while (uVar20 != uVar19);
      }
      if (0 < (int)uVar2) {
        uVar19 = 0;
        puVar15 = local_68;
        do {
          *(undefined2 *)puVar15 = *(undefined2 *)((long)pvVar16 + uVar19 * 2);
          uVar19 = uVar19 + 1;
          puVar15 = puVar15 + iVar4;
        } while (uVar20 != uVar19);
      }
      if (0 < (int)uVar2) {
        uVar19 = 0;
        puVar15 = local_60;
        do {
          *(undefined2 *)puVar15 = *(undefined2 *)((long)pvVar23 + uVar19 * 2);
          uVar19 = uVar19 + 1;
          puVar15 = puVar15 + iVar3;
        } while (uVar20 != uVar19);
      }
      pvVar17 = (void *)((long)pvVar17 + lVar14);
      puVar12 = puVar12 + iVar10;
      puVar22 = puVar22 + iVar9;
      local_68 = local_68 + iVar8;
      local_60 = local_60 + iVar7;
      iVar13 = iVar13 + 1;
      pvVar21 = (void *)((long)pvVar21 + lVar14);
      pvVar16 = (void *)((long)pvVar16 + lVar14);
      pvVar23 = (void *)((long)pvVar23 + lVar14);
    } while (iVar13 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             inc0, inc1, inc2, inc3;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    inc3  = decode->channels[3].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out3 + x * inc3)) = one_to_native16 (in3[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}